

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O1

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,Ref<embree::Stream<int>_> *chars,string *id,bool hasHeader,
                bool hasTail)

{
  pointer pcVar1;
  XML *this_00;
  bool bVar2;
  TokenStream *this_01;
  long *plVar3;
  Token *pTVar4;
  runtime_error *this_02;
  size_type *psVar5;
  Ref<embree::Stream<embree::Token>_> cin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  symbols;
  Ref<embree::XML> *xml;
  Ref<embree::Stream<embree::Token>_> local_e8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  XML *local_80;
  string local_78;
  long *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_e0 + 0x10;
  local_e0._0_8_ = pcVar1;
  local_80 = (XML *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"<!--","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"-->","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"<?","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"?>","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"</","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"/>","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"<","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,">","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"=","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  this_01 = (TokenStream *)operator_new(0x360);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &TokenStream::alpha_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &TokenStream::ALPHA_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78.field_2._8_8_ = plVar3[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)(id->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    local_e0._16_8_ = *psVar5;
    aStack_c8._M_allocated_capacity = plVar3[3];
    local_e0._0_8_ = pcVar1;
  }
  else {
    local_e0._16_8_ = *psVar5;
    local_e0._0_8_ = (size_type *)*plVar3;
  }
  local_e0._8_8_ = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  TokenStream::TokenStream
            (this_01,chars,(string *)local_e0,(string *)TokenStream::separators_abi_cxx11_,&local_98
            );
  local_e8.ptr = (Stream<embree::Token> *)this_01;
  (*(this_01->super_Stream<embree::Token>).super_RefCount._vptr_RefCount[2])(this_01);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_);
  }
  this_00 = local_80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (hasHeader) {
    parseHeader((embree *)&local_58,&local_e8);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 0x18))();
    }
  }
  parseComments(&local_e8);
  parseXML((embree *)this_00,&local_e8,0);
  parseComments(&local_e8);
  if (!hasTail) {
    pTVar4 = Stream<embree::Token>::peek((Stream<embree::Token> *)this_01);
    local_a8 = 0xffffffff;
    uStack_a4 = 0xffffffff;
    uStack_a0 = 0xffffffff;
    uStack_9c = 0xffffffff;
    local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
    local_e0._16_8_ = 0;
    aStack_c8._0_8_ = aStack_c8._0_8_ & 0xffffffffffffff00;
    local_b8._M_ptr = (element_type *)0x0;
    local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e0._8_8_ = &aStack_c8;
    bVar2 = operator==(pTVar4,(Token *)local_e0);
    if (local_b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._8_8_ != &aStack_c8) {
      operator_delete((void *)local_e0._8_8_);
    }
    if (!bVar2) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar4 = Stream<embree::Token>::peek((Stream<embree::Token> *)this_01);
      ParseLocation::str_abi_cxx11_(&local_78,&pTVar4->loc);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_e0._0_8_ = *plVar3;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_e0._0_8_ == psVar5) {
        local_e0._16_8_ = *psVar5;
        aStack_c8._M_allocated_capacity = plVar3[3];
        local_e0._0_8_ = pcVar1;
      }
      else {
        local_e0._16_8_ = *psVar5;
      }
      local_e0._8_8_ = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(this_02,(string *)local_e0);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (*(this_01->super_Stream<embree::Token>).super_RefCount._vptr_RefCount[3])(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return (Ref<embree::XML>)this_00;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<int> > chars, std::string id, bool hasHeader = true, bool hasTail = false)
  {
    /* create lexer for XML file */
    std::vector<std::string> symbols;
    symbols.push_back("<!--");
    symbols.push_back("-->");
    symbols.push_back("<?");
    symbols.push_back("?>");
    symbols.push_back("</");
    symbols.push_back("/>");
    symbols.push_back("<");
    symbols.push_back(">");
    symbols.push_back("=");
    Ref<Stream<Token> > cin = new TokenStream(chars,TokenStream::alpha + TokenStream::ALPHA + "_" + id, TokenStream::separators, symbols);

    if (hasHeader) parseHeader(cin);
    parseComments(cin);
    Ref<XML> xml = parseXML(cin,0);
    parseComments(cin);

    if (!hasTail)
      if (cin->peek() != Token::Eof()) THROW_RUNTIME_ERROR(cin->peek().Location().str()+": end of file expected");

    return xml;
  }